

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::eliNone(void)

{
  bool bVar1;
  pointer this;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_38;
  __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
  local_30;
  iterator it;
  Mid *now;
  iterator __end1;
  iterator __begin1;
  vector<Parser::Mid,_std::allocator<Parser::Mid>_> *__range1;
  
  __end1 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::begin
                     ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids);
  now = (Mid *)std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::end
                         ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Parser::Mid_*,_std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>_>
                                     *)&now), bVar1) {
    it._M_current =
         (Rule *)__gnu_cxx::
                 __normal_iterator<Parser::Mid_*,_std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>_>
                 ::operator*(&__end1);
    local_30._M_current =
         (Rule *)std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::begin
                           (&((reference)it._M_current)->rules);
    while( true ) {
      local_38._M_current =
           (Rule *)std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::end
                             ((vector<Parser::Rule,_std::allocator<Parser::Rule>_> *)
                              &it._M_current[1].rights.
                               super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
             ::operator->(&local_30);
      bVar1 = std::vector<Parser::Node,_std::allocator<Parser::Node>_>::empty(&this->rights);
      if (bVar1) {
        *(undefined1 *)
         &it._M_current[1].rights.super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
          _M_impl.super__Vector_impl_data._M_finish = 1;
        __gnu_cxx::
        __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
        ::operator++(&local_30);
      }
      else {
        __gnu_cxx::
        __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
        ::operator++(&local_30);
      }
    }
    __gnu_cxx::
    __normal_iterator<Parser::Mid_*,_std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void eliNone(){
        for(auto &now:mids){
            auto it = now.rules.begin();
            while(it != now.rules.end()){
                if(it->rights.empty()){
                    now.canNone=true;
                    //it = now.rules.erase(it);
                    ++it;
                }else ++it;
            }
        }
    }